

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_uuencode.c
# Opt level: O1

int archive_filter_uuencode_close(archive_write_filter *f)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  
  pvVar1 = f->data;
  if (*(size_t *)((long)pvVar1 + 0x40) != 0) {
    uu_encode((archive_string *)((long)pvVar1 + 0x20),(uchar *)((long)pvVar1 + 0x48),
              *(size_t *)((long)pvVar1 + 0x40));
  }
  archive_string_sprintf((archive_string *)((long)pvVar1 + 0x20),"`\nend\n");
  archive_write_set_bytes_in_last_block(f->archive,1);
  iVar2 = __archive_write_filter
                    (f->next_filter,*(void **)((long)pvVar1 + 0x20),*(size_t *)((long)pvVar1 + 0x28)
                    );
  iVar3 = __archive_write_close_filter(f->next_filter);
  if (iVar2 < iVar3) {
    iVar3 = iVar2;
  }
  return iVar3;
}

Assistant:

static int
archive_filter_uuencode_close(struct archive_write_filter *f)
{
	struct private_uuencode *state = (struct private_uuencode *)f->data;
	int ret, ret2;

	/* Flush remaining bytes. */
	if (state->hold_len != 0)
		uu_encode(&state->encoded_buff, state->hold, state->hold_len);
	archive_string_sprintf(&state->encoded_buff, "`\nend\n");
	/* Write the last block */
	archive_write_set_bytes_in_last_block(f->archive, 1);
	ret = __archive_write_filter(f->next_filter,
	    state->encoded_buff.s, archive_strlen(&state->encoded_buff));
	ret2 = __archive_write_close_filter(f->next_filter);
	if (ret > ret2)
		ret = ret2;
	return (ret);
}